

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sitersol.c
# Opt level: O3

void spsolve(int n,float *x,float *y)

{
  char equed [1];
  float rcond;
  float rpg;
  int_t info;
  
  equed[0] = 'N';
  spsolve::XX.nrow = n;
  spsolve::YY.nrow = n;
  spsolve::X.lda = n;
  spsolve::X.nzval = x;
  spsolve::Y.lda = n;
  spsolve::Y.nzval = y;
  sgsisx(GLOBAL_OPTIONS,GLOBAL_A,GLOBAL_PERM_C,GLOBAL_PERM_R,(int *)0x0,equed,GLOBAL_R,GLOBAL_C,
         GLOBAL_L,GLOBAL_U,(void *)0x0,0,&spsolve::YY,&spsolve::XX,&rpg,&rcond,(GlobalLU_t *)0x0,
         GLOBAL_MEM_USAGE,GLOBAL_STAT,&info);
  return;
}

Assistant:

void spsolve(int n, float x[], float y[])
{
    SuperMatrix *A = GLOBAL_A, *L = GLOBAL_L, *U = GLOBAL_U;
    SuperLUStat_t *stat = GLOBAL_STAT;
    int *perm_c = GLOBAL_PERM_C, *perm_r = GLOBAL_PERM_R;
    char equed[1] = {'N'};
    float *R = GLOBAL_R, *C = GLOBAL_C;
    superlu_options_t *options = GLOBAL_OPTIONS;
    mem_usage_t  *mem_usage = GLOBAL_MEM_USAGE;
    int_t info;
    static DNformat X, Y;
    static SuperMatrix XX = {SLU_DN, SLU_S, SLU_GE, 1, 1, &X};
    static SuperMatrix YY = {SLU_DN, SLU_S, SLU_GE, 1, 1, &Y};
    float rpg, rcond;

    XX.nrow = YY.nrow = n;
    X.lda = Y.lda = n;
    X.nzval = x;
    Y.nzval = y;

#if 0
    dcopy_(&n, y, &i_1, x, &i_1);
    sgstrs(NOTRANS, L, U, perm_c, perm_r, &XX, stat, &info);
#else
    sgsisx(options, A, perm_c, perm_r, NULL, equed, R, C,
	   L, U, NULL, 0, &YY, &XX, &rpg, &rcond, NULL,
	   mem_usage, stat, &info);
#endif
}